

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

HighsInt create(HighsIndexCollection *index_collection,HighsInt num_set_entries,HighsInt *set,
               HighsInt dimension)

{
  pointer piVar1;
  bool bVar2;
  HighsInt HVar3;
  ulong uVar4;
  ulong uVar5;
  allocator_type local_49;
  pointer local_48;
  pointer piStack_40;
  pointer local_38;
  
  if (num_set_entries < 0) {
    return 1;
  }
  if (dimension < 0) {
    HVar3 = 2;
  }
  else {
    index_collection->dimension_ = dimension;
    index_collection->is_set_ = true;
    std::vector<int,std::allocator<int>>::vector<int_const*,void>
              ((vector<int,std::allocator<int>> *)&local_48,set,set + (uint)num_set_entries,
               &local_49);
    piVar1 = (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piStack_40;
    (index_collection->set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = (pointer)0x0;
    piStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1);
    }
    if (local_48 != (pointer)0x0) {
      operator_delete(local_48);
    }
    index_collection->set_num_entries_ = num_set_entries;
    bVar2 = increasingSetOk(&index_collection->set_,1,0,true);
    HVar3 = 3;
    if ((bVar2) && (HVar3 = 0, num_set_entries != 0)) {
      uVar5 = 1;
      if (1 < num_set_entries) {
        uVar5 = (ulong)(uint)num_set_entries;
      }
      uVar4 = 0;
      do {
        if ((uint)dimension <= (uint)set[uVar4]) {
          return ~(uint)uVar4;
        }
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
      HVar3 = 0;
    }
  }
  return HVar3;
}

Assistant:

HighsInt create(HighsIndexCollection& index_collection,
                const HighsInt num_set_entries, const HighsInt* set,
                const HighsInt dimension) {
  // Create an index collection for the given set - so long as it is strictly
  // ordered
  if (num_set_entries < 0) return kIndexCollectionCreateIllegalSetSize;
  if (dimension < 0) return kIndexCollectionCreateIllegalSetDimension;
  index_collection.dimension_ = dimension;
  index_collection.is_set_ = true;
  index_collection.set_ = {set, set + num_set_entries};
  index_collection.set_num_entries_ = num_set_entries;
  if (!increasingSetOk(index_collection.set_, 1, 0, true))
    return kIndexCollectionCreateIllegalSetOrder;
  for (HighsInt ix = 0; ix < num_set_entries; ix++)
    if (set[ix] < 0 || set[ix] >= dimension) return -(ix + 1);
  return kIndexCollectionCreateOk;
}